

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

void __thiscall RenX::Server::sendLogChan(Server *this,char *fmt,...)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  undefined8 uVar4;
  __sv_type _Var5;
  size_t local_d0;
  char *local_c8;
  size_t local_c0;
  char *local_b8;
  long local_b0;
  size_t i;
  IRC_Bot *server;
  allocator<char> local_69;
  string_view local_68;
  undefined1 local_58 [8];
  string message;
  va_list args;
  char *fmt_local;
  Server *this_local;
  
  message.field_2._12_4_ = 0x30;
  message.field_2._8_4_ = 0x10;
  local_68 = getPrefix(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_58,&local_68,&local_69);
  std::allocator<char>::~allocator(&local_69);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if (!bVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,' ');
  }
  vstring_printf_abi_cxx11_((string *)&server,fmt,(__va_list_tag *)((long)&message.field_2 + 8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&server);
  std::__cxx11::string::~string((string *)&server);
  for (local_b0 = 0; lVar3 = ServerManager::size(), local_b0 != lVar3; local_b0 = local_b0 + 1) {
    uVar4 = ServerManager::getServer(_serverManager);
    iVar1 = this->m_logChanType;
    _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    local_c0 = _Var5._M_len;
    local_b8 = _Var5._M_str;
    Jupiter::IRC::Client::messageChannels(uVar4,iVar1,local_c0,local_b8);
    iVar1 = this->m_adminLogChanType;
    _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    local_d0 = _Var5._M_len;
    local_c8 = _Var5._M_str;
    Jupiter::IRC::Client::messageChannels(uVar4,iVar1,local_d0,local_c8);
  }
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void RenX::Server::sendLogChan(const char *fmt, ...) const {
	va_list args;
	va_start(args, fmt);

	std::string message{ getPrefix() };
	if (!message.empty()) {
		message += ' ';
	}
	message += vstring_printf(fmt, args);

	IRC_Bot* server;
	for (size_t i = 0; i != serverManager->size(); i++) {
		server = serverManager->getServer(i);
		server->messageChannels(m_logChanType, message);
		server->messageChannels(m_adminLogChanType, message);
	}
}